

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O3

coda_url * __thiscall coda_url::operator=(coda_url *this,coda_url *u)

{
  uint uVar1;
  uint32_t uVar2;
  char *pcVar3;
  ulong __size;
  
  if (this->val_str != (char *)0x0) {
    free(this->val_str);
  }
  uVar1 = u->val_len;
  if ((ulong)uVar1 == 0) {
    pcVar3 = (char *)0x0;
    this->val_len = 0;
    this->dom_len = 0;
    this->val_str = (char *)0x0;
  }
  else {
    this->val_len = uVar1;
    uVar2 = u->dom_len;
    this->dom_len = uVar2;
    __size = (ulong)(uVar2 + uVar1 + 2);
    pcVar3 = (char *)malloc(__size);
    this->val_str = pcVar3;
    memcpy(pcVar3,u->val_str,__size);
    pcVar3 = pcVar3 + (ulong)uVar1 + 1;
  }
  this->dom_str = pcVar3;
  return this;
}

Assistant:

coda_url &coda_url::operator= (const coda_url &u)
{
	if (allocated())
	{
		free(val_str);
	}

	if (u.empty())
	{
		val_len = 0;
		dom_len = 0;

		val_str = NULL;
		dom_str = NULL;
	}
	else
	{
		val_len = u.val_len;
		dom_len = u.dom_len;

		val_str = (char *) malloc(val_len + dom_len + 2);
		memcpy(val_str, u.val_str, val_len + dom_len + 2);

		dom_str = val_str + val_len + 1;
	}

	return *this;
}